

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pomdpx.cpp
# Opt level: O1

void __thiscall despot::POMDPX::ComputeDefaultActions(POMDPX *this,string *type)

{
  pointer pVVar1;
  pointer piVar2;
  int iVar3;
  uint uVar4;
  ostream *poVar5;
  long lVar6;
  
  iVar3 = std::__cxx11::string::compare((char *)type);
  if (iVar3 == 0) {
    (*(this->super_MDP)._vptr_MDP[6])(this);
    uVar4 = (*(this->super_MDP)._vptr_MDP[2])(this);
    std::vector<int,_std::allocator<int>_>::resize(&this->default_action_,(long)(int)uVar4);
    if (0 < (int)uVar4) {
      pVVar1 = (this->super_MDP).policy_.
               super__Vector_base<despot::ValuedAction,_std::allocator<despot::ValuedAction>_>.
               _M_impl.super__Vector_impl_data._M_start;
      piVar2 = (this->default_action_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar6 = 0;
      do {
        *(ACT_TYPE *)((long)piVar2 + lVar6) = (&pVVar1->action)[lVar6];
        lVar6 = lVar6 + 4;
      } while ((ulong)uVar4 << 2 != lVar6);
    }
    return;
  }
  poVar5 = std::operator<<((ostream *)&std::cerr,"Unsupported default action type ");
  poVar5 = std::operator<<(poVar5,(string *)type);
  std::endl<char,std::char_traits<char>>(poVar5);
  exit(0);
}

Assistant:

void POMDPX::ComputeDefaultActions(string type) const {
	if (type == "MDP") {
		const_cast<POMDPX*>(this)->ComputeOptimalPolicyUsingVI();
		int num_states = NumStates();
		default_action_.resize(num_states);
		for (int s = 0; s < num_states; s++) {
			default_action_[s] = policy_[s].action;
		}
	} else {
		cerr << "Unsupported default action type " << type << endl;
		exit(0);
	}
}